

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

void __thiscall
QScrollerPrivate::updateVelocity(QScrollerPrivate *this,QPointF *deltaPixelRaw,qint64 deltaTime)

{
  QPointF *p1;
  QPointF QVar1;
  QScrollerPropertiesPrivate *pQVar2;
  undefined1 auVar3 [16];
  QDebug QVar4;
  undefined8 uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  QPointF QVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QPointF QVar28;
  QPointF local_d8;
  QPointF local_c8;
  QDebug local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  QPointF local_88;
  undefined4 uStack_78;
  undefined4 local_74;
  char *local_70;
  QDebug local_68;
  undefined1 local_60 [8];
  undefined1 local_58 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (deltaTime < 1) goto LAB_00656982;
  QVar28 = QScroller::pixelPerMeter(this->q_ptr);
  pQVar2 = (this->properties).d.d;
  QVar17 = *deltaPixelRaw;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_88.xp._0_4_ = 2;
    local_88.xp._4_4_ = 0;
    local_88.yp._0_4_ = 0;
    local_88.yp._4_4_ = 0;
    uStack_78 = 0;
    local_74 = 0;
    local_70 = lcScroller::category.name;
    QMessageLogger::debug();
    QVar4.stream = local_68.stream;
    QVar21.m_data = (storage_type *)0x1a;
    QVar21.m_size = (qsizetype)(local_60 + 8);
    QString::fromUtf8(QVar21);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)(local_60 + 8));
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    local_60 = (undefined1  [8])local_68.stream;
    *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
    ::operator<<((Stream *)local_98,(QPointF *)local_60);
    uVar5 = local_98._0_8_;
    QVar22.m_data = (storage_type *)0xe;
    QVar22.m_size = (qsizetype)(local_60 + 8);
    QString::fromUtf8(QVar22);
    QTextStream::operator<<((QTextStream *)uVar5,(QString *)(local_60 + 8));
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    if (*(QTextStream *)(local_98._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
    }
    QTextStream::operator<<((QTextStream *)local_98._0_8_,deltaTime);
    if (*(QTextStream *)(local_98._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
    }
    uVar5 = local_98._0_8_;
    QVar23.m_data = (storage_type *)0xc;
    QVar23.m_size = (qsizetype)(local_60 + 8);
    QString::fromUtf8(QVar23);
    QTextStream::operator<<((QTextStream *)uVar5,(QString *)(local_60 + 8));
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    if (*(QTextStream *)(local_98._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
    }
    QDebug::~QDebug((QDebug *)local_98);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug(&local_68);
  }
  dVar19 = (double)deltaTime;
  QVar1 = *deltaPixelRaw;
  uVar10 = (undefined4)((ulong)dVar19 >> 0x20);
  auVar14._8_4_ = SUB84(dVar19,0);
  auVar14._0_8_ = dVar19;
  auVar14._12_4_ = uVar10;
  auVar14 = divpd((undefined1  [16])QVar1,auVar14);
  dVar20 = auVar14._0_8_;
  dVar13 = auVar14._8_8_;
  uVar7 = -(ulong)(dVar20 < -dVar20);
  uVar8 = -(ulong)(dVar13 < -dVar13);
  auVar15._0_8_ =
       (double)(~uVar8 & (ulong)dVar13 | (ulong)-dVar13 & uVar8) +
       (double)(~uVar7 & (ulong)dVar20 | (ulong)-dVar20 & uVar7);
  if (2.5 < (auVar15._0_8_ / ((QVar28.xp + QVar28.yp) * 0.5)) * 1000.0) {
    auVar16._0_8_ = QVar28.xp * QVar1.xp * 2.5;
    auVar16._8_8_ = QVar28.yp * QVar1.yp * 2.5;
    auVar14 = divpd(auVar16,_DAT_006f7850);
    auVar15._8_8_ = auVar15._0_8_;
    QVar17 = (QPointF)divpd(auVar14,auVar15);
  }
  auVar3._8_4_ = SUB84(dVar19,0);
  auVar3._0_8_ = dVar19;
  auVar3._12_4_ = uVar10;
  auVar14 = divpd((undefined1  [16])QVar17,auVar3);
  auVar18._0_8_ = auVar14._0_8_ * -1000.0;
  auVar18._8_8_ = auVar14._8_8_ * -1000.0;
  local_98 = divpd(auVar18,(undefined1  [16])QVar28);
  if (50.0 <= dVar19) {
    dVar19 = 50.0;
  }
  dVar20 = pQVar2->dragVelocitySmoothingFactor;
  p1 = &this->releaseVelocity;
  local_88.xp._0_4_ = 0;
  local_88.xp._4_4_ = 0;
  local_88.yp._0_4_ = 0;
  local_88.yp._4_4_ = 0;
  bVar6 = qFuzzyCompare(p1,&local_88);
  lcScroller();
  if ((99 < (ulong)deltaTime) || (bVar6)) {
    if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_88.xp._0_4_ = 2;
      local_88.xp._4_4_ = 0;
      local_88.yp._0_4_ = 0;
      local_88.yp._4_4_ = 0;
      uStack_78 = 0;
      local_74 = 0;
      local_70 = lcScroller::category.name;
      QMessageLogger::debug();
      QVar4.stream = local_68.stream;
      QVar26.m_data = (storage_type *)0x10;
      QVar26.m_size = (qsizetype)(local_60 + 8);
      QString::fromUtf8(QVar26);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)(local_60 + 8));
      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
      if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_68.stream,' ');
      }
      local_c8.xp = (qreal)local_68.stream;
      *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
      ::operator<<((QDebug)&local_c8.yp,&local_c8);
      QDebug::~QDebug((QDebug *)&local_c8.yp);
      QDebug::~QDebug((QDebug *)&local_c8);
      QDebug::~QDebug(&local_68);
    }
  }
  else {
    dVar20 = (dVar19 * dVar20) / 50.0;
    if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_88.xp._0_4_ = 2;
      local_88.xp._4_4_ = 0;
      local_88.yp._0_4_ = 0;
      local_88.yp._4_4_ = 0;
      uStack_78 = 0;
      local_74 = 0;
      local_70 = lcScroller::category.name;
      QMessageLogger::debug();
      QVar4.stream = local_b8.stream;
      QVar24.m_data = (storage_type *)0xe;
      QVar24.m_size = (qsizetype)(local_60 + 8);
      QString::fromUtf8(QVar24);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)(local_60 + 8));
      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
      if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
      }
      *(int *)((QTextStream *)local_b8.stream + 0x28) =
           *(int *)((QTextStream *)local_b8.stream + 0x28) + 1;
      ::operator<<((Stream *)&local_68,(QPointF *)local_b0);
      QVar4.stream = local_68.stream;
      QVar25.m_data = (storage_type *)0x4;
      QVar25.m_size = (qsizetype)(local_60 + 8);
      QString::fromUtf8(QVar25);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)(local_60 + 8));
      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
      if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_68.stream,' ');
      }
      local_b0._8_8_ = local_68.stream;
      *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
      dVar13 = (1.0 - dVar20) * (this->releaseVelocity).yp + dVar20 * (double)local_98._8_8_;
      local_58._8_4_ = SUB84(dVar13,0);
      local_58._0_8_ = (1.0 - dVar20) * p1->xp + dVar20 * (double)local_98._0_8_;
      local_58._12_4_ = (int)((ulong)dVar13 >> 0x20);
      ::operator<<((Stream *)local_a0,(QPointF *)(local_b0 + 8));
      QDebug::~QDebug((QDebug *)local_a0);
      QDebug::~QDebug((QDebug *)(local_b0 + 8));
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug((QDebug *)local_b0);
      QDebug::~QDebug(&local_b8);
    }
    dVar13 = p1->xp;
    if (((double)local_98._0_8_ != 0.0) || (NAN((double)local_98._0_8_))) {
      bVar6 = (double)local_98._0_8_ < 0.0;
      if (0.0 <= dVar13) {
        bVar6 = 0.0 < (double)local_98._0_8_ != dVar13 <= 0.0 && 0.0 <= (double)local_98._0_8_;
      }
      if (bVar6) goto LAB_006566cf;
    }
    else {
LAB_006566cf:
      local_98._0_8_ = (double)local_98._0_8_ * dVar20 + (1.0 - dVar20) * dVar13;
    }
    dVar13 = (this->releaseVelocity).yp;
    if (((double)local_98._8_8_ != 0.0) || (NAN((double)local_98._8_8_))) {
      bVar6 = (double)local_98._8_8_ < 0.0;
      if (0.0 <= dVar13) {
        bVar6 = 0.0 < (double)local_98._8_8_ != dVar13 <= 0.0 && 0.0 <= (double)local_98._8_8_;
      }
      if (!bVar6) goto LAB_00656851;
    }
    local_98._8_8_ = (double)local_98._8_8_ * dVar20 + (1.0 - dVar20) * dVar13;
  }
LAB_00656851:
  dVar20 = pQVar2->maximumVelocity;
  uVar9 = SUB84(dVar20,0);
  uVar11 = (undefined4)((ulong)dVar20 >> 0x20);
  dVar13 = -dVar20;
  uVar10 = uVar9;
  if ((double)local_98._0_8_ <= dVar20) {
    uVar10 = local_98._0_4_;
    uVar11 = local_98._4_4_;
  }
  uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
  if ((double)CONCAT44(uVar11,uVar10) <= dVar13) {
    uVar10 = uVar9;
    uVar11 = uVar12;
  }
  (this->releaseVelocity).xp = (qreal)CONCAT44(uVar11,uVar10);
  dVar20 = pQVar2->maximumVelocity;
  uVar10 = SUB84(dVar20,0);
  uVar11 = (undefined4)((ulong)dVar20 >> 0x20);
  if ((double)local_98._8_8_ <= dVar20) {
    uVar10 = local_98._8_4_;
    uVar11 = local_98._12_4_;
  }
  if ((double)CONCAT44(uVar11,uVar10) <= dVar13) {
    uVar10 = uVar9;
    uVar11 = uVar12;
  }
  (this->releaseVelocity).yp = (qreal)CONCAT44(uVar11,uVar10);
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_88.xp._0_4_ = 2;
    local_88.xp._4_4_ = 0;
    local_88.yp._0_4_ = 0;
    local_88.yp._4_4_ = 0;
    uStack_78 = 0;
    local_74 = 0;
    local_70 = lcScroller::category.name;
    QMessageLogger::debug();
    QVar4.stream = local_68.stream;
    QVar27.m_data = (storage_type *)0x13;
    QVar27.m_size = (qsizetype)(local_60 + 8);
    QString::fromUtf8(QVar27);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)(local_60 + 8));
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    *(int *)((QTextStream *)local_68.stream + 0x28) =
         *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
    ::operator<<((QDebug)&local_d8.yp,&local_d8);
    QDebug::~QDebug((QDebug *)&local_d8.yp);
    QDebug::~QDebug((QDebug *)&local_d8);
    QDebug::~QDebug(&local_68);
  }
LAB_00656982:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::updateVelocity(const QPointF &deltaPixelRaw, qint64 deltaTime)
{
    if (deltaTime <= 0)
        return;

    Q_Q(QScroller);
    QPointF ppm = q->pixelPerMeter();
    const QScrollerPropertiesPrivate *sp = properties.d.data();
    QPointF deltaPixel = deltaPixelRaw;

    qCDebug(lcScroller) << "QScroller::updateVelocity(" << deltaPixelRaw
                        << " [delta pix], " << deltaTime << " [delta ms])";

    // faster than 2.5mm/ms seems bogus (that would be a screen height in ~20 ms)
    if (((deltaPixelRaw / qreal(deltaTime)).manhattanLength() / ((ppm.x() + ppm.y()) / 2) * 1000) > qreal(2.5))
        deltaPixel = deltaPixelRaw * qreal(2.5) * ppm / 1000 / (deltaPixelRaw / qreal(deltaTime)).manhattanLength();

    QPointF newv = -deltaPixel / qreal(deltaTime) * qreal(1000) / ppm;
    // around 95% of all updates are in the [1..50] ms range, so make sure
    // to scale the smoothing factor over that range: this way a 50ms update
    // will have full impact, while 5ms update will only have a 10% impact.
    qreal smoothing = sp->dragVelocitySmoothingFactor * qMin(qreal(deltaTime), qreal(50)) / qreal(50);

    // only smooth if we already have a release velocity and only if the
    // user hasn't stopped to move his finger for more than 100ms
    if ((releaseVelocity != QPointF(0, 0)) && (deltaTime < 100)) {
        qCDebug(lcScroller) << "SMOOTHED from " << newv << " to "
                            << newv * smoothing + releaseVelocity * (qreal(1) - smoothing);
        // smooth x or y only if the new velocity is either 0 or at least in
        // the same direction of the release velocity
        if (!newv.x() || (qSign(releaseVelocity.x()) == qSign(newv.x())))
            newv.setX(newv.x() * smoothing + releaseVelocity.x() * (qreal(1) - smoothing));
        if (!newv.y() || (qSign(releaseVelocity.y()) == qSign(newv.y())))
            newv.setY(newv.y() * smoothing + releaseVelocity.y() * (qreal(1) - smoothing));
    } else
        qCDebug(lcScroller) << "NO SMOOTHING to " << newv;

    releaseVelocity.setX(qBound(-sp->maximumVelocity, newv.x(), sp->maximumVelocity));
    releaseVelocity.setY(qBound(-sp->maximumVelocity, newv.y(), sp->maximumVelocity));

    qCDebug(lcScroller) << "  --> new velocity:" << releaseVelocity;
}